

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.h
# Opt level: O0

shared_ptr<mocker::ast::BuiltinType> mocker::mk_ast::tyBool(void)

{
  int iVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<mocker::ast::BuiltinType> sVar2;
  
  if (tyBool()::res == '\0') {
    iVar1 = __cxa_guard_acquire(&tyBool()::res);
    if (iVar1 != 0) {
      std::make_shared<mocker::ast::BuiltinType,mocker::ast::BuiltinType::Type>
                ((Type *)&tyBool::res);
      __cxa_atexit(std::shared_ptr<mocker::ast::BuiltinType>::~shared_ptr,&tyBool::res,&__dso_handle
                  );
      __cxa_guard_release(&tyBool()::res);
    }
  }
  std::shared_ptr<mocker::ast::BuiltinType>::shared_ptr
            ((shared_ptr<mocker::ast::BuiltinType> *)in_RDI,&tyBool::res);
  sVar2.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<mocker::ast::BuiltinType>)
         sVar2.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<ast::BuiltinType> tyBool() {
  static auto res = std::make_shared<ast::BuiltinType>(ast::BuiltinType::Bool);
  return res;
}